

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void ARGBBlendRow_C(uint8 *src_argb0,uint8 *src_argb1,uint8 *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  uint8 uVar3;
  uint8 uVar4;
  int iVar5;
  int iVar6;
  
  if (1 < width) {
    iVar5 = 0;
    do {
      bVar1 = src_argb1[1];
      bVar2 = src_argb1[2];
      iVar6 = 0x100 - (uint)src_argb0[3];
      uVar3 = src_argb0[1];
      uVar4 = src_argb0[2];
      *dst_argb = (char)((uint)*src_argb1 * iVar6 >> 8) + *src_argb0;
      dst_argb[1] = (char)((uint)bVar1 * iVar6 >> 8) + uVar3;
      dst_argb[2] = (char)(iVar6 * (uint)bVar2 >> 8) + uVar4;
      dst_argb[3] = 0xff;
      bVar1 = src_argb1[5];
      bVar2 = src_argb1[6];
      iVar6 = 0x100 - (uint)src_argb0[7];
      uVar3 = src_argb0[5];
      uVar4 = src_argb0[6];
      dst_argb[4] = (char)((uint)src_argb1[4] * iVar6 >> 8) + src_argb0[4];
      dst_argb[5] = (char)((uint)bVar1 * iVar6 >> 8) + uVar3;
      dst_argb[6] = (char)(iVar6 * (uint)bVar2 >> 8) + uVar4;
      dst_argb[7] = 0xff;
      src_argb0 = src_argb0 + 8;
      src_argb1 = src_argb1 + 8;
      dst_argb = dst_argb + 8;
      iVar5 = iVar5 + 2;
    } while (iVar5 < width + -1);
  }
  if ((width & 1U) != 0) {
    bVar1 = src_argb1[1];
    bVar2 = src_argb1[2];
    iVar5 = 0x100 - (uint)src_argb0[3];
    uVar3 = src_argb0[1];
    uVar4 = src_argb0[2];
    *dst_argb = (char)((uint)*src_argb1 * iVar5 >> 8) + *src_argb0;
    dst_argb[1] = (char)((uint)bVar1 * iVar5 >> 8) + uVar3;
    dst_argb[2] = (char)(iVar5 * (uint)bVar2 >> 8) + uVar4;
    dst_argb[3] = 0xff;
  }
  return;
}

Assistant:

void ARGBBlendRow_C(const uint8* src_argb0,
                    const uint8* src_argb1,
                    uint8* dst_argb,
                    int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint32 fb = src_argb0[0];
    uint32 fg = src_argb0[1];
    uint32 fr = src_argb0[2];
    uint32 a = src_argb0[3];
    uint32 bb = src_argb1[0];
    uint32 bg = src_argb1[1];
    uint32 br = src_argb1[2];
    dst_argb[0] = BLEND(fb, bb, a);
    dst_argb[1] = BLEND(fg, bg, a);
    dst_argb[2] = BLEND(fr, br, a);
    dst_argb[3] = 255u;

    fb = src_argb0[4 + 0];
    fg = src_argb0[4 + 1];
    fr = src_argb0[4 + 2];
    a = src_argb0[4 + 3];
    bb = src_argb1[4 + 0];
    bg = src_argb1[4 + 1];
    br = src_argb1[4 + 2];
    dst_argb[4 + 0] = BLEND(fb, bb, a);
    dst_argb[4 + 1] = BLEND(fg, bg, a);
    dst_argb[4 + 2] = BLEND(fr, br, a);
    dst_argb[4 + 3] = 255u;
    src_argb0 += 8;
    src_argb1 += 8;
    dst_argb += 8;
  }

  if (width & 1) {
    uint32 fb = src_argb0[0];
    uint32 fg = src_argb0[1];
    uint32 fr = src_argb0[2];
    uint32 a = src_argb0[3];
    uint32 bb = src_argb1[0];
    uint32 bg = src_argb1[1];
    uint32 br = src_argb1[2];
    dst_argb[0] = BLEND(fb, bb, a);
    dst_argb[1] = BLEND(fg, bg, a);
    dst_argb[2] = BLEND(fr, br, a);
    dst_argb[3] = 255u;
  }
}